

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_104a6::BuildSystemFrontendTest_commandSkipping_Test::TestBody
          (BuildSystemFrontendTest_commandSkipping_Test *this)

{
  FileSystem *pFVar1;
  bool bVar2;
  long *plVar3;
  int line;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar6;
  char *in_R9;
  internal iVar7;
  BuildSystemInvocation *invocation;
  StringRef s;
  StringRef expected;
  StringRef expected_00;
  AssertionResult gtest_ar__2;
  __node_gen_type __node_gen;
  BuildSystemFrontend frontend;
  TestBuildSystemFrontendDelegate delegate;
  AssertHelper local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  long local_1d0;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  string local_1c0;
  BuildSystemFrontend local_1a0;
  BuildSystemInvocation *local_198;
  TmpDir *local_190;
  string local_188;
  long local_168;
  long local_160;
  SourceMgr *local_138;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_130;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_128;
  TestBuildSystemFrontendDelegate local_120;
  
  s.Length = 0x143;
  s.Data = 
  "\nclient:\n    name: client\n\ntargets:\n    \"\": [\"3\"]\n\ncommands:\n    1:\n        tool: shell\n        outputs: [\"1\"]\n        args: touch 1\n\n    2:\n        tool: shell\n        inputs: [\"1\"]\n        outputs: [\"2\"]\n        args: touch 2\n\n    3:\n        tool: shell\n        inputs: [\"2\"]\n        outputs: [\"3\"]\n        args: touch 3\n"
  ;
  BuildSystemFrontendTest::writeBuildFile(&this->super_BuildSystemFrontendTest,s);
  local_138 = &(this->super_BuildSystemFrontendTest).sourceMgr;
  TestBuildSystemFrontendDelegate::TestBuildSystemFrontendDelegate(&local_120,local_138);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"2","");
  local_1e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&local_120 + 0xb8);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)((long)&local_120 + 0xb8),&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  invocation = &(this->super_BuildSystemFrontendTest).invocation;
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
            (&local_1a0,&local_120.super_BuildSystemFrontendDelegate,invocation,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_128);
  if (local_128._M_head_impl != (FileSystem *)0x0) {
    (*(local_128._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_128._M_head_impl = (FileSystem *)0x0;
  bVar2 = llbuild::buildsystem::BuildSystemFrontend::build(&local_1a0,(StringRef)ZEXT816(0x209faf));
  local_1e0._M_head_impl._0_1_ = bVar2;
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    expected.Length = 0x151;
    expected.Data =
         "\ncommandPreparing: 3\ncommandPreparing: 2\ncommandPreparing: 1\nshouldCommandStart: 1\ncommandStarted: 1\ncommandProcessStarted: 1\ncommandProcessFinished: 1: 0\ncommandFinished: 1: 0\nshouldCommandStart: 2\ncommandFinished: 2: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n"
    ;
    bVar2 = TestBuildSystemFrontendDelegate::checkTrace(&local_120,expected);
    local_1e0._M_head_impl._0_1_ = bVar2;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1e0,
                 (AssertionResult *)
                 "delegate.checkTrace(R\"END(\ncommandPreparing: 3\ncommandPreparing: 2\ncommandPreparing: 1\nshouldCommandStart: 1\ncommandStarted: 1\ncommandProcessStarted: 1\ncommandProcessFinished: 1: 0\ncommandFinished: 1: 0\nshouldCommandStart: 2\ncommandFinished: 2: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n)END\")"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,0x12d,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      goto LAB_0011fe04;
    }
    pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
             super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
             .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    local_190 = &(this->super_BuildSystemFrontendTest).tempDir;
    llbuild::TmpDir::str_abi_cxx11_(&local_1c0,local_190);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2)
    ;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar4
       ) {
      local_1d0 = *(long *)pbVar4;
      uStack_1c8 = (undefined4)plVar3[3];
      uStack_1c4 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    }
    else {
      local_1d0 = *(long *)pbVar4;
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
    }
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[1];
    *plVar3 = (long)pbVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_198 = invocation;
    (*pFVar1->_vptr_FileSystem[7])(&local_188,pFVar1,&local_1e0);
    local_1f0.data_._0_1_ =
         (internal)
         ((((local_188.field_2._8_8_ != 0 || local_188.field_2._M_allocated_capacity != 0) ||
           local_168 != 0) ||
          (local_188._M_string_length != 0 ||
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) || local_160 != 0);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0) {
      operator_delete(local_1e0._M_head_impl,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    invocation = local_198;
    if (local_1f0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1f0,
                 (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/1\").isMissing()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,0x12f,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
LAB_00120547:
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
      pbVar5 = local_1e8;
      if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0011fe40;
      goto LAB_0011fe45;
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
    pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
             super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
             .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    llbuild::TmpDir::str_abi_cxx11_(&local_1c0,local_190);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2)
    ;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar4
       ) {
      local_1d0 = *(long *)pbVar4;
      uStack_1c8 = (undefined4)plVar3[3];
      uStack_1c4 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    }
    else {
      local_1d0 = *(long *)pbVar4;
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
    }
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[1];
    *plVar3 = (long)pbVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (*pFVar1->_vptr_FileSystem[7])(&local_188,pFVar1,&local_1e0);
    local_1f0.data_._0_1_ =
         (internal)
         ((((local_188.field_2._8_8_ == 0 && local_188.field_2._M_allocated_capacity == 0) &&
           local_168 == 0) &&
          (local_188._M_string_length == 0 &&
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) && local_160 == 0);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0) {
      operator_delete(local_1e0._M_head_impl,local_1d0 + 1);
    }
    invocation = local_198;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1f0,
                 (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/2\").isMissing()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,0x130,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      goto LAB_00120547;
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
    pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
             super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
             .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    llbuild::TmpDir::str_abi_cxx11_(&local_1c0,local_190);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2)
    ;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar4
       ) {
      local_1d0 = *(long *)pbVar4;
      uStack_1c8 = (undefined4)plVar3[3];
      uStack_1c4 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    }
    else {
      local_1d0 = *(long *)pbVar4;
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
    }
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[1];
    *plVar3 = (long)pbVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (*pFVar1->_vptr_FileSystem[7])(&local_188,pFVar1,&local_1e0);
    local_1f0.data_._0_1_ =
         (internal)
         ((((local_188.field_2._8_8_ != 0 || local_188.field_2._M_allocated_capacity != 0) ||
           local_168 != 0) ||
          (local_188._M_string_length != 0 ||
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) || local_160 != 0);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0) {
      operator_delete(local_1e0._M_head_impl,local_1d0 + 1);
    }
    invocation = local_198;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    iVar7 = local_1f0.data_._0_1_;
    if (local_1f0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1f0,
                 (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/3\").isMissing()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,0x131,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&local_1e0,(AssertionResult *)"frontend.build(\"\")","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
               ,0x11b,local_188._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
LAB_0011fe04:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1c0._M_dataplus._M_p + 8))();
    }
    if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1d8;
      pbVar5 = local_1d8;
LAB_0011fe40:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar6,pbVar5);
    }
LAB_0011fe45:
    iVar7 = (internal)0x0;
  }
  llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(&local_1a0);
  local_120.super_BuildSystemFrontendDelegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__TestBuildSystemFrontendDelegate_002546a8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)((long)&local_120 + 0xb8));
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)((long)&local_120 + 0x80));
  if (local_120.traceData._M_dataplus._M_p != (pointer)((long)&local_120 + 0x70U)) {
    operator_delete(local_120.traceData._M_dataplus._M_p,
                    local_120.traceData.field_2._M_allocated_capacity + 1);
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
            (&local_120.super_BuildSystemFrontendDelegate);
  if (iVar7 == (internal)0x0) {
    return;
  }
  TestBuildSystemFrontendDelegate::TestBuildSystemFrontendDelegate(&local_120,local_138);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
            (&local_1a0,&local_120.super_BuildSystemFrontendDelegate,invocation,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_130);
  if (local_130._M_head_impl != (FileSystem *)0x0) {
    (*(local_130._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_130._M_head_impl = (FileSystem *)0x0;
  bVar2 = llbuild::buildsystem::BuildSystemFrontend::build(&local_1a0,(StringRef)ZEXT816(0x209faf));
  local_1e0._M_head_impl._0_1_ = bVar2;
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    expected_00.Length = 0x111;
    expected_00.Data =
         "\ncommandPreparing: 2\nshouldCommandStart: 2\ncommandStarted: 2\ncommandProcessStarted: 2\ncommandProcessFinished: 2: 0\ncommandFinished: 2: 0\ncommandPreparing: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n"
    ;
    bVar2 = TestBuildSystemFrontendDelegate::checkTrace(&local_120,expected_00);
    local_1e0._M_head_impl._0_1_ = bVar2;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1e0,
                 (AssertionResult *)
                 "delegate.checkTrace(R\"END(\ncommandPreparing: 2\nshouldCommandStart: 2\ncommandStarted: 2\ncommandProcessStarted: 2\ncommandProcessFinished: 2: 0\ncommandFinished: 2: 0\ncommandPreparing: 3\nshouldCommandStart: 3\ncommandStarted: 3\ncommandProcessStarted: 3\ncommandProcessFinished: 3: 0\ncommandFinished: 3: 0\n)END\")"
                 ,"false","true",in_R9);
      line = 0x14a;
      goto LAB_00120053;
    }
    pFVar1 = (this->super_BuildSystemFrontendTest).fs._M_t.
             super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
             .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    llbuild::TmpDir::str_abi_cxx11_(&local_1c0,&(this->super_BuildSystemFrontendTest).tempDir);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar3 + 2)
    ;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3 == pbVar4
       ) {
      local_1d0 = *(long *)pbVar4;
      uStack_1c8 = (undefined4)plVar3[3];
      uStack_1c4 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    }
    else {
      local_1d0 = *(long *)pbVar4;
      local_1e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar3;
    }
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar3[1];
    *plVar3 = (long)pbVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (*pFVar1->_vptr_FileSystem[7])(&local_188,pFVar1,&local_1e0);
    local_1f0.data_._0_1_ =
         (internal)
         ((((local_188.field_2._8_8_ != 0 || local_188.field_2._M_allocated_capacity != 0) ||
           local_168 != 0) ||
          (local_188._M_string_length != 0 ||
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) || local_160 != 0);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0) {
      operator_delete(local_1e0._M_head_impl,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_188,(internal *)&local_1f0,
                 (AssertionResult *)"fs->getFileInfo(tempDir.str() + \"/2\").isMissing()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
                 ,0x14c,local_188._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c0,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
    }
    if (local_1e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00120360;
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1e8;
    pbVar5 = local_1e8;
  }
  else {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&local_1e0,(AssertionResult *)"frontend.build(\"\")","false",
               "true",in_R9);
    line = 0x13b;
LAB_00120053:
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemFrontendTest.cpp"
               ,line,local_188._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1c0._M_dataplus._M_p + 8))();
    }
    if (local_1d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00120360;
    pdVar6 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d8;
    pbVar5 = local_1d8;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar6,pbVar5);
LAB_00120360:
  llbuild::buildsystem::BuildSystemFrontend::~BuildSystemFrontend(&local_1a0);
  local_120.super_BuildSystemFrontendDelegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__TestBuildSystemFrontendDelegate_002546a8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)((long)&local_120 + 0xb8));
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)((long)&local_120 + 0x80));
  if (local_120.traceData._M_dataplus._M_p != (pointer)((long)&local_120 + 0x70U)) {
    operator_delete(local_120.traceData._M_dataplus._M_p,
                    local_120.traceData.field_2._M_allocated_capacity + 1);
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
            (&local_120.super_BuildSystemFrontendDelegate);
  return;
}

Assistant:

TEST_F(BuildSystemFrontendTest, commandSkipping) {
  writeBuildFile(R"END(
client:
    name: client

targets:
    "": ["3"]

commands:
    1:
        tool: shell
        outputs: ["1"]
        args: touch 1

    2:
        tool: shell
        inputs: ["1"]
        outputs: ["2"]
        args: touch 2

    3:
        tool: shell
        inputs: ["2"]
        outputs: ["3"]
        args: touch 3
)END");

  {
    TestBuildSystemFrontendDelegate delegate(sourceMgr);
    delegate.commandsToSkip.insert("2");

    BuildSystemFrontend frontend(delegate, invocation, createLocalFileSystem());
    ASSERT_TRUE(frontend.build(""));

    ASSERT_TRUE(delegate.checkTrace(R"END(
commandPreparing: 3
commandPreparing: 2
commandPreparing: 1
shouldCommandStart: 1
commandStarted: 1
commandProcessStarted: 1
commandProcessFinished: 1: 0
commandFinished: 1: 0
shouldCommandStart: 2
commandFinished: 2: 3
shouldCommandStart: 3
commandStarted: 3
commandProcessStarted: 3
commandProcessFinished: 3: 0
commandFinished: 3: 0
)END"));

    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/1").isMissing());
    ASSERT_TRUE(fs->getFileInfo(tempDir.str() + "/2").isMissing());
    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/3").isMissing());
  }

  // If we rebuild incrementally without skipping, we expect to run 2 and
  // re-run 3. 1 doesn't have to run at all, so we don't expect to get asked
  // if it should start.
  {
    TestBuildSystemFrontendDelegate delegate(sourceMgr);

    BuildSystemFrontend frontend(delegate, invocation, createLocalFileSystem());
    ASSERT_TRUE(frontend.build(""));

    ASSERT_TRUE(delegate.checkTrace(R"END(
commandPreparing: 2
shouldCommandStart: 2
commandStarted: 2
commandProcessStarted: 2
commandProcessFinished: 2: 0
commandFinished: 2: 0
commandPreparing: 3
shouldCommandStart: 3
commandStarted: 3
commandProcessStarted: 3
commandProcessFinished: 3: 0
commandFinished: 3: 0
)END"));

    ASSERT_FALSE(fs->getFileInfo(tempDir.str() + "/2").isMissing());
  }

}